

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  undefined8 uVar4;
  element_type *peVar5;
  element_type *peVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  undefined8 extraout_RAX;
  ActualDstType actualDst;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double mass_phi2;
  double mass_phi1;
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmyy2;
  double Jmzz2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmyy1;
  double Jmzz1;
  ChMatrixNM<double,_12,_12> Rotsect;
  ChMatrixNM<double,_6,_6> Tm2;
  ChMatrixNM<double,_6,_6> Tm1;
  ChMatrixNM<double,_12,_12> Tm;
  undefined8 auStack_12be [9];
  undefined1 *apuStack_1270 [14];
  double local_1200;
  double local_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  double local_11e0;
  undefined1 local_11d8 [8];
  undefined1 local_11d0 [8];
  undefined1 auStack_11c8 [8];
  undefined8 local_11c0;
  double local_11b8;
  undefined8 local_11b0;
  double local_11a8;
  double local_11a0;
  undefined8 local_1198;
  double local_1190;
  double local_1180 [6];
  double local_1150;
  undefined8 local_1148;
  double local_1140;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined1 local_10f0 [8];
  undefined1 local_10e8 [8];
  undefined1 local_10e0 [8];
  double local_10d8;
  double local_10d0;
  undefined1 local_10c8 [8];
  undefined1 local_10c0 [8];
  undefined1 local_10b8 [8];
  double local_10b0;
  double local_10a8;
  Scalar local_10a0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_1098;
  Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  *local_1088;
  Matrix<double,_12,_12,_1,_12,_12> local_1080;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  double dStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 uStack_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  double dStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  non_const_type local_ac0;
  RhsNested pMStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  double dStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  double dStack_a48;
  undefined8 uStack_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 uStack_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  Matrix<double,_12,_12,_1,_12,_12> local_980;
  Product<Eigen::Transpose<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>,_Eigen::Matrix<double,_12,_12,_1,_12,_12>,_0>
  local_500;
  Matrix<double,_12,_12,_1,_12,_12> *local_4f0;
  undefined8 uStack_4e8;
  double dStack_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  double dStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  double dStack_270;
  undefined8 uStack_268;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 uStack_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  double dStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined1 extraout_var [56];
  
  lVar14 = 0;
  apuStack_1270[5] = (undefined1 *)0x5fbb92;
  memset(M,0,0x480);
  apuStack_1270[5] = (undefined1 *)0x5fbb9d;
  local_11f0 = (double)(**(code **)((long)(((this->sectionA).
                                            super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                          super_ChBeamSectionEulerAdvancedGeneric.
                                          super_ChBeamSectionEuler.super_ChBeamSection.
                                          _vptr_ChBeamSection + 0x58))();
  peVar5 = (this->sectionA).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  apuStack_1270[6] = local_10c8;
  local_1100 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_10f8 = 0;
  local_1110 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_1108 = 0;
  apuStack_1270[5] = (undefined1 *)0x5fbc0a;
  (**(code **)((long)(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar5,&local_10b0,&local_10a8,local_10b8,local_11d8,local_10c0);
  local_11f8 = local_10b0 + local_10a8;
  apuStack_1270[5] = (undefined1 *)0x5fbc26;
  local_1200 = (double)(**(code **)((long)(((this->sectionB).
                                            super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                          super_ChBeamSectionEulerAdvancedGeneric.
                                          super_ChBeamSectionEuler.super_ChBeamSection.
                                          _vptr_ChBeamSection + 0x58))();
  peVar5 = (this->sectionB).
           super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  apuStack_1270[6] = local_10f0;
  local_1120 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.My;
  uStack_1118 = 0;
  local_1130 = (peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
               super_ChBeamSectionEulerAdvancedGeneric.Mz;
  uStack_1128 = 0;
  apuStack_1270[5] = (undefined1 *)0x5fbc93;
  (**(code **)((long)(peVar5->super_ChBeamSectionRayleighAdvancedGeneric).
                     super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                     super_ChBeamSection._vptr_ChBeamSection + 0x168))
            (peVar5,&local_10d8,&local_10d0,local_10e0,&local_11e0,local_10e8);
  dVar27 = this->length;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar27;
  peVar6 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  dVar2 = peVar6->phimy;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar2;
  dVar3 = peVar6->phimz;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar3;
  dVar7 = dVar27 * dVar27;
  dVar8 = dVar2 * dVar2;
  dVar9 = dVar3 * dVar3;
  auVar16 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar49,ZEXT816(0x3fb999999999999a));
  auVar17 = vfmadd213sd_avx512f(ZEXT816(0xbfe0000000000000),auVar37,ZEXT816(0x3fb999999999999a));
  auVar18 = vfmadd213sd_avx512f(ZEXT816(0x3fc5555555555555),auVar49,ZEXT816(0x3fc1111111111111));
  auVar19 = vfmadd231sd_avx512f(ZEXT816(0x3fc1111111111111),auVar37,ZEXT816(0x3fc5555555555555));
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar9;
  auVar20 = vfmadd231sd_avx512f(auVar19,auVar39,ZEXT816(0x3fd5555555555555));
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar8;
  auVar21 = vfmadd231sd_avx512f(auVar18,auVar50,ZEXT816(0x3fd5555555555555));
  dVar10 = (0.0 / dVar27) * (0.0 / dVar27);
  dVar11 = (dVar2 + 1.0) * (dVar2 + 1.0);
  dVar3 = (dVar3 + 1.0) * (dVar3 + 1.0);
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar49,ZEXT816(0x3fd7c57c57c57c58));
  auVar19 = vfmadd213sd_fma(ZEXT816(0x3fe6666666666666),auVar37,ZEXT816(0x3fd7c57c57c57c58));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar50,ZEXT816(0x3fd5555555555555));
  auVar19 = vfmadd231sd_avx512f(auVar19,auVar39,ZEXT816(0x3fd5555555555555));
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar10;
  auVar18 = vfmadd231sd_fma(auVar18,auVar44,ZEXT816(0x3ff3333333333333));
  auVar19 = vfmadd231sd_fma(auVar19,auVar44,ZEXT816(0x3ff3333333333333));
  dVar34 = auVar19._0_8_ / dVar3;
  dVar31 = auVar18._0_8_ / dVar11;
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar49,ZEXT816(0x3fc0750750750750));
  auVar19 = vfmadd213sd_fma(ZEXT816(0x3fd3333333333333),auVar37,ZEXT816(0x3fc0750750750750));
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar8;
  auVar38 = ZEXT816(0x3fc5555555555555);
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar51,auVar38);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar9;
  auVar22 = vfmadd231sd_avx512f(auVar19,auVar40,auVar38);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar10;
  auVar19 = vfmadd231sd_fma(auVar18,auVar45,ZEXT816(0xbff3333333333333));
  auVar22 = vfmadd231sd_fma(auVar22,auVar45,ZEXT816(0xbff3333333333333));
  auVar23 = vfmadd213sd_avx512f(ZEXT816(0x3fb7777777777777),auVar37,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar18 = vfmadd213sd_fma(ZEXT816(0x3fb7777777777777),auVar49,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar23 = vfmadd231sd_avx512f(auVar23,auVar40,ZEXT816(0x3fa5555555555555));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar51,ZEXT816(0x3fa5555555555555));
  auVar23 = vfmadd231sd_avx512f(auVar23,auVar17,auVar45);
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar16,auVar45);
  auVar23 = vmulsd_avx512f(auVar30,auVar23);
  auVar24 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar49,ZEXT816(0x3f9fb1fb1fb1fb20));
  auVar25 = vfmadd213sd_avx512f(ZEXT816(0x3fb3333333333333),auVar37,ZEXT816(0x3f9fb1fb1fb1fb20));
  dVar43 = auVar23._0_8_ / dVar3;
  dVar36 = (dVar27 * auVar18._0_8_) / dVar11;
  auVar18 = vfmadd231sd_avx512f(auVar24,auVar51,ZEXT816(0x3fa5555555555555));
  auVar23 = vfmadd231sd_avx512f(auVar25,auVar40,ZEXT816(0x3fa5555555555555));
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar10;
  auVar18 = vfnmadd231sd_avx512f(auVar18,auVar46,auVar16);
  auVar16 = vfnmadd231sd_avx512f(auVar23,auVar46,auVar17);
  auVar16 = vmulsd_avx512f(auVar30,auVar16);
  auVar18 = vmulsd_avx512f(auVar30,auVar18);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = dVar3;
  auVar16 = vdivsd_avx512f(auVar16,auVar48);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar11;
  auVar17 = vdivsd_avx512f(auVar18,auVar53);
  auVar18 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar49,ZEXT816(0x3f83813813813814));
  auVar23 = vfmadd231sd_avx512f(ZEXT816(0x3f83813813813814),auVar37,ZEXT816(0x3f91111111111111));
  auVar23 = vfmadd231sd_avx512f(auVar23,auVar40,ZEXT816(0x3f81111111111111));
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar51,ZEXT816(0x3f81111111111111));
  auVar20 = vfmadd213sd_avx512f(auVar20,auVar46,auVar23);
  auVar18 = vfmadd213sd_avx512f(auVar21,auVar46,auVar18);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar7;
  auVar20 = vmulsd_avx512f(auVar21,auVar20);
  auVar18 = vmulsd_avx512f(auVar21,auVar18);
  auVar20 = vdivsd_avx512f(auVar20,auVar48);
  auVar21 = vdivsd_avx512f(auVar18,auVar53);
  auVar18 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar49,ZEXT816(0x3f7d41d41d41d41d));
  auVar23 = vfmadd213sd_avx512f(auVar49,auVar38,ZEXT816(0x3fa1111111111111));
  auVar24 = vfmadd213sd_avx512f(ZEXT816(0x3f91111111111111),auVar37,ZEXT816(0x3f7d41d41d41d41d));
  auVar25 = vfmadd213sd_avx512f(auVar38,auVar37,ZEXT816(0x3fa1111111111111));
  dVar10 = dVar27 * local_11f0;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar8;
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar52,ZEXT816(0x3f81111111111111));
  auVar23 = vfmadd231sd_avx512f(auVar23,ZEXT816(0xbfc5555555555555),auVar52);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar9;
  auVar24 = vfmadd231sd_avx512f(auVar24,auVar41,ZEXT816(0x3f81111111111111));
  auVar25 = vfmadd231sd_avx512f(auVar25,auVar41,ZEXT816(0xbfc5555555555555));
  local_1200 = dVar27 * local_1200;
  auVar23 = vfmadd213sd_avx512f(auVar23,auVar46,auVar18);
  auVar18 = vfmadd213sd_avx512f(auVar25,auVar46,auVar24);
  dVar8 = dVar27 * peVar6->mu;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar7;
  auVar24 = vmulsd_avx512f(auVar24,auVar18);
  dVar2 = peVar6->Jmxx;
  dVar9 = dVar8 * (auVar19._0_8_ / dVar11);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       dVar10 / 3.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_1200 / 3.0;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar8;
  auVar18 = vdivsd_avx512f(auVar47,ZEXT816(0x4018000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x48;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 6;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_11f8;
  auVar18 = vmulsd_avx512f(auVar30,auVar18);
  dVar12 = dVar10 * dVar43;
  auVar18 = vdivsd_avx512f(auVar18,ZEXT816(0x4008000000000000));
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x27;
  vmovsd_avx512f(auVar18);
  *pdVar1 = *pdVar1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = ((local_10d8 + local_10d0) * dVar27) / 3.0;
  dVar27 = (dVar27 * dVar2) / 6.0;
  local_11f0 = -0.0;
  uStack_11e8 = 0x8000000000000000;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = dVar27;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = dVar27;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = dVar10 * dVar31;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = dVar10 * dVar34;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar10;
  auVar18 = vmulsd_avx512f(auVar38,auVar21);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar18._0_8_;
  auVar18 = vmulsd_avx512f(auVar38,auVar20);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = auVar18._0_8_;
  dVar27 = dVar8 * (auVar22._0_8_ / dVar3);
  auVar25._0_8_ = -dVar8;
  auVar25._8_8_ = 0x8000000000000000;
  auVar18 = vmulsd_avx512f(auVar17,auVar25);
  auVar19 = vmulsd_avx512f(auVar16,auVar25);
  dVar2 = ((auVar23._0_8_ * dVar7) / dVar11) * auVar25._0_8_;
  dVar3 = (auVar24._0_8_ / dVar3) * auVar25._0_8_;
  dVar43 = dVar43 * -local_1200;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_1200 * dVar31;
  auVar22 = vmulsd_avx512f(auVar47,auVar16);
  auVar16 = vmulsd_avx512f(auVar47,auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_1200 * dVar34;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_1200;
  auVar17 = vmulsd_avx512f(auVar42,auVar21);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar17._0_8_;
  auVar17 = vmulsd_avx512f(auVar42,auVar20);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar17._0_8_;
  dVar7 = dVar36 * -dVar10;
  local_1200 = local_1200 * dVar36;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar7;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = dVar12;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = dVar27;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = dVar9;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = auVar22._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = auVar18._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = auVar16._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = auVar19._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = local_1200;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar43;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = dVar7;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = dVar12;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = dVar27;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = dVar9;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = auVar22._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = auVar18._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = auVar16._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = auVar19._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = dVar2;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = local_1200;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = dVar43;
  local_1200 = (double)local_11d8;
  apuStack_1270[5] = (undefined1 *)0x5fc179;
  local_11f8 = cos((double)local_11d8);
  apuStack_1270[5] = (undefined1 *)0x5fc18a;
  auVar29._0_8_ = sin(local_1200);
  auVar29._8_56_ = extraout_var;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_11f8;
  local_1180[0] = 1.0;
  local_1180[1] = 0.0;
  local_1150 = auVar29._0_8_ * 0.0;
  dVar27 = local_11f8 * 0.0;
  local_1180[2] = -0.0;
  local_1180[3] = local_1150 - dVar27;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_1150;
  auVar18 = vfmadd213sd_fma(ZEXT816(0),auVar19,auVar20);
  local_1150 = dVar27 + local_1150;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar27;
  auVar19 = vfmsub213sd_fma(auVar16,ZEXT816(0) << 0x40,auVar29._0_16_);
  local_1180[4] = auVar18._0_8_;
  local_1148 = auVar19._0_8_;
  local_1140 = local_11f8;
  local_1200 = local_11e0;
  apuStack_1270[5] = (undefined1 *)0x5fc223;
  local_1180[5] = auVar29._0_8_;
  local_11f8 = cos(local_11e0);
  apuStack_1270[5] = (undefined1 *)0x5fc234;
  auVar26._0_8_ = sin(local_1200);
  auVar26._8_56_ = extraout_var_00;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_11f8;
  local_11d0 = (undefined1  [8])0x3ff0000000000000;
  auStack_11c8 = (undefined1  [8])0x0;
  dVar27 = auVar26._0_8_ * 0.0;
  local_11a0 = local_11f8 * 0.0;
  local_11c0 = 0x8000000000000000;
  local_11b8 = dVar27 - local_11a0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_11a0;
  auVar19 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar17,auVar26._0_16_);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar27;
  auVar18 = vfmadd213sd_fma(ZEXT816(0),auVar22,auVar23);
  local_11a0 = local_11a0 + dVar27;
  local_11b0 = auVar18._0_8_;
  local_1198 = auVar19._0_8_;
  local_1190 = local_11f8;
  apuStack_1270[5] = (undefined1 *)0x5fc2c3;
  local_11a8 = auVar26._0_8_;
  memset(&local_1080,0,0x480);
  do {
    uVar13 = *(undefined8 *)((long)local_1180 + lVar14 + 8);
    uVar4 = *(undefined8 *)((long)local_1180 + lVar14 + 0x10);
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4) = *(undefined8 *)((long)local_1180 + lVar14);
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4 + 8) = uVar13;
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4 + 0x10) = uVar4;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x48);
  lVar14 = 0x52;
  do {
    uVar13 = *(undefined8 *)(local_11d0 + lVar14 + 6);
    uVar4 = *(undefined8 *)(auStack_11c8 + lVar14 + 6);
    *(undefined8 *)((long)&local_1098.m_rhs + lVar14 * 4) = *(undefined8 *)(local_11d8 + lVar14 + 6)
    ;
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4 + -8) = uVar13;
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4) = uVar4;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x9a);
  lVar14 = 0xa0;
  do {
    uVar13 = *(undefined8 *)((long)apuStack_1270 + lVar14 + 8);
    uVar4 = *(undefined8 *)((long)apuStack_1270 + lVar14 + 0x10);
    *(undefined8 *)((long)&local_1098.m_rhs + lVar14 * 4) =
         *(undefined8 *)((long)apuStack_1270 + lVar14);
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4 + -8) = uVar13;
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4) = uVar4;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0xe8);
  lVar14 = 0xee;
  do {
    uVar13 = *(undefined8 *)((long)auStack_12be + lVar14 + 8);
    uVar4 = *(undefined8 *)((long)auStack_12be + lVar14 + 0x10);
    *(undefined8 *)((long)&local_1098.m_rhs + lVar14 * 4) =
         *(undefined8 *)((long)auStack_12be + lVar14);
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4 + -8) = uVar13;
    *(undefined8 *)
     ((long)local_1080.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.
            m_data.array + lVar14 * 4) = uVar4;
    lVar14 = lVar14 + 0x18;
  } while (lVar14 != 0x136);
  apuStack_1270[5] = (undefined1 *)0x5fc3ac;
  local_500.m_lhs.m_matrix = &local_1080;
  local_500.m_rhs = M;
  local_4f0 = &local_1080;
  memset(&local_980,0,0x480);
  local_ac0 = (non_const_type)0x3ff0000000000000;
  apuStack_1270[5] = (undefined1 *)0x5fc3d2;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
            (&local_980,&local_500,&local_1080,(Scalar *)&local_ac0);
  auVar29 = _DAT_0096cc00;
  auVar26 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
  uVar15 = CONCAT71((int7)((ulong)extraout_RAX >> 8),0x3f) & 0xffffffff;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[0];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[1] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[1];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[2] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[2];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[3] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[3];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[4] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[4];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[5] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[5];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[6] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[6];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[7] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[7];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[8] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[8];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[9] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[9];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[10] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xb]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xb];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xc];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xd];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xe]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xe];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xf]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xf];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x10]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x11];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x12]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x12];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x13];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x14]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x14];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x15]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x15];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x16]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x16];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x17];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x18];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x19];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x20];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x21]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x21];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x22];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x23]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x23];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x24];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x25];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x26];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x27];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x28]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x28];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x29]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x29];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x30];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x31];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x32];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x33];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x34];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x35]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x35];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x36]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x36];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x37]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x37];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x38];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x39]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x39];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x40];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x41];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x42]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x42];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x43];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x44]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x44];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x45]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x45];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x46]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x46];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x47];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x48];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x49]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x49];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x50]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x50];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x51]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x51];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x52]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x52];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x53]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x53];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x54];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x55];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x56];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x57]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x57];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x58]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x58];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x59];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x60];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x61];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x62];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[99] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[99];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[100];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x65];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x66];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x67];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x68];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x69]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x69];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x70]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x70];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x71]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x71];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x72];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x73];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x74];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x75];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x76]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x76];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x77]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x77];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x78];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x79];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x80];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x81];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x82];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x83]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x83];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x84];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x85];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x86]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x86];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x87];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x88];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x89];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8f];
  uStack_9c0 = 0;
  uStack_9b8 = 0;
  uStack_9b0 = 0;
  uStack_9a8 = 0;
  local_a00 = 0;
  uStack_9f8 = 0;
  local_9f0 = 0;
  uStack_9e8 = 0;
  uStack_9e0 = 0;
  uStack_9d8 = 0;
  uStack_9d0 = 0;
  uStack_9c8 = 0;
  uStack_a40 = 0;
  uStack_a38 = 0;
  uStack_a30 = 0;
  uStack_a28 = 0;
  uStack_a20 = 0;
  uStack_a18 = 0;
  uStack_a10 = 0;
  uStack_a08 = 0;
  local_a80 = 0;
  uStack_a70 = 0;
  uStack_a68 = 0;
  uStack_a60 = 0;
  uStack_a58 = 0;
  uStack_a50 = 0;
  local_ac0 = (non_const_type)0x0;
  pMStack_ab8 = (RhsNested)0x0;
  uStack_ab0 = 0;
  uStack_aa8 = 0;
  uStack_a90 = 0;
  uStack_a88 = 0;
  vscatterqpd_avx512f(ZEXT864(&local_ac0) + auVar29,uVar15,auVar26);
  uStack_b00 = 0;
  uStack_af8 = 0;
  uStack_af0 = 0;
  uStack_ae8 = 0;
  local_b40 = 0;
  uStack_b38 = 0;
  local_b30 = 0;
  uStack_b28 = 0;
  local_b20 = 0;
  uStack_b18 = 0;
  uStack_b10 = 0;
  uStack_b08 = 0;
  local_b80 = 0;
  uStack_b78 = 0;
  uStack_b70 = 0;
  uStack_b68 = 0;
  uStack_b60 = 0;
  uStack_b58 = 0;
  uStack_b50 = 0;
  uStack_b48 = 0;
  uStack_bc0 = 0;
  uStack_bb0 = 0;
  uStack_ba8 = 0;
  uStack_ba0 = 0;
  uStack_b98 = 0;
  uStack_b90 = 0;
  local_c00 = 0;
  uStack_bf8 = 0;
  uStack_bf0 = 0;
  uStack_be8 = 0;
  uStack_bd0 = 0;
  uStack_bc8 = 0;
  dStack_aa0 = local_1110;
  auVar33._0_4_ = (uint)local_1100 ^ (uint)local_11f0;
  auVar33._4_4_ = local_1100._4_4_ ^ local_11f0._4_4_;
  auVar33._8_4_ = (uint)uStack_10f8 ^ (uint)uStack_11e8;
  auVar33._12_4_ = uStack_10f8._4_4_ ^ uStack_11e8._4_4_;
  auVar35._0_4_ = (uint)local_1110 ^ (uint)local_11f0;
  auVar35._4_4_ = local_1110._4_4_ ^ local_11f0._4_4_;
  auVar35._8_4_ = (uint)uStack_1108 ^ (uint)uStack_11e8;
  auVar35._12_4_ = uStack_1108._4_4_ ^ uStack_11e8._4_4_;
  uStack_a98 = vmovlps_avx(auVar33);
  uStack_a78 = vmovlps_avx(auVar35);
  dStack_a48 = local_1100;
  vscatterqpd_avx512f(ZEXT864(&local_c00) + auVar29,uVar15,auVar26);
  dStack_be0 = local_1130;
  auVar28._0_4_ = (uint)local_1120 ^ (uint)local_11f0;
  auVar28._4_4_ = local_1120._4_4_ ^ local_11f0._4_4_;
  auVar28._8_4_ = (uint)uStack_1118 ^ (uint)uStack_11e8;
  auVar28._12_4_ = uStack_1118._4_4_ ^ uStack_11e8._4_4_;
  auVar32._0_4_ = (uint)local_1130 ^ (uint)local_11f0;
  auVar32._4_4_ = local_1130._4_4_ ^ local_11f0._4_4_;
  auVar32._8_4_ = (uint)uStack_1128 ^ (uint)uStack_11e8;
  auVar32._12_4_ = uStack_1128._4_4_ ^ uStack_11e8._4_4_;
  uStack_bd8 = vmovlps_avx(auVar28);
  uStack_bb8 = vmovlps_avx(auVar32);
  dStack_b88 = local_1120;
  apuStack_1270[5] = (undefined1 *)0x5fc5d5;
  memset(&local_500,0,0x480);
  local_500.m_lhs.m_matrix = local_ac0;
  local_500.m_rhs = pMStack_ab8;
  local_4f0 = (Matrix<double,_12,_12,_1,_12,_12> *)uStack_ab0;
  uStack_4e8 = uStack_aa8;
  dStack_4e0 = dStack_aa0;
  uStack_4d8 = uStack_a98;
  local_4a0 = uStack_a90;
  uStack_498 = uStack_a88;
  local_490 = local_a80;
  uStack_488 = uStack_a78;
  uStack_480 = uStack_a70;
  uStack_478 = uStack_a68;
  local_440 = uStack_a60;
  uStack_438 = uStack_a58;
  local_430 = uStack_a50;
  dStack_428 = dStack_a48;
  uStack_420 = uStack_a40;
  uStack_418 = uStack_a38;
  local_3e0 = uStack_a30;
  uStack_3d8 = uStack_a28;
  uStack_3d0 = uStack_a20;
  uStack_3c8 = uStack_a18;
  local_3c0 = uStack_a10;
  uStack_3b8 = uStack_a08;
  local_380 = local_a00;
  uStack_378 = uStack_9f8;
  local_370 = local_9f0;
  uStack_368 = uStack_9e8;
  uStack_360 = uStack_9e0;
  uStack_358 = uStack_9d8;
  local_320 = uStack_9d0;
  uStack_318 = uStack_9c8;
  local_310 = uStack_9c0;
  uStack_308 = uStack_9b8;
  uStack_300 = uStack_9b0;
  uStack_2f8 = uStack_9a8;
  local_290 = local_c00;
  uStack_288 = uStack_bf8;
  local_280 = uStack_bf0;
  uStack_278 = uStack_be8;
  dStack_270 = dStack_be0;
  uStack_268 = uStack_bd8;
  local_230 = uStack_bd0;
  uStack_228 = uStack_bc8;
  uStack_220 = uStack_bc0;
  uStack_218 = uStack_bb8;
  local_210 = uStack_bb0;
  uStack_208 = uStack_ba8;
  local_1d0 = uStack_ba0;
  uStack_1c8 = uStack_b98;
  local_1c0 = uStack_b90;
  dStack_1b8 = dStack_b88;
  local_1b0 = local_b80;
  uStack_1a8 = uStack_b78;
  local_170 = uStack_b70;
  uStack_168 = uStack_b68;
  local_160 = uStack_b60;
  uStack_158 = uStack_b58;
  local_150 = uStack_b50;
  uStack_148 = uStack_b48;
  local_110 = local_b40;
  uStack_108 = uStack_b38;
  local_100 = local_b30;
  uStack_f8 = uStack_b28;
  local_f0 = local_b20;
  uStack_e8 = uStack_b18;
  local_b0 = uStack_b10;
  uStack_a8 = uStack_b08;
  local_a0 = uStack_b00;
  uStack_98 = uStack_af8;
  local_90 = uStack_af0;
  uStack_88 = uStack_ae8;
  apuStack_1270[5] = (undefined1 *)0x5fc7da;
  local_1098.m_lhs.m_matrix = (non_const_type)&local_500;
  local_1098.m_rhs = M;
  local_1088 = &local_500;
  memset(&local_980,0,0x480);
  local_10a0 = 1.0;
  apuStack_1270[5] = (undefined1 *)0x5fc7fd;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,12,12,1,12,12>>,Eigen::Matrix<double,12,12,1,12,12>,0>,Eigen::Matrix<double,12,12,1,12,12>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,12,12,1,12,12>>
            (&local_980,&local_1098,(Matrix<double,_12,_12,_1,_12,_12> *)&local_500,&local_10a0);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[0];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[1] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[1];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[2] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[2];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[3] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[3];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[4] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[4];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[5] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[5];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[6] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[6];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[7] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[7];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[8] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[8];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[9] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[9];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[10] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xb]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xb];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xc];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xd]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xd];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xe]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xe];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xf]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0xf];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x10]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x10];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x11]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x11];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x12]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x12];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x13]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x13];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x14]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x14];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x15]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x15];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x16]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x16];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x17]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x17];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x18];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x19];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x1f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x20]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x20];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x21]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x21];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x22]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x22];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x23]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x23];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x24];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x25]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x25];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x26]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x26];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x27];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x28]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x28];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x29]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x29];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x2f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x2f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x30];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x31];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x32];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x33];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x34];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x35]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x35];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x36]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x36];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x37]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x37];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x38]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x38];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x39]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x39];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x3f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x40];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x41]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x41];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x42]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x42];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x43]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x43];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x44]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x44];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x45]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x45];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x46]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x46];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x47]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x47];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x48];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x49]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x49];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x4f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x50]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x50];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x51]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x51];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x52]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x52];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x53]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x53];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x54];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x55];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x56];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x57]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x57];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x58]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x58];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x59]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x59];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x5f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x60];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x61];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x62];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[99] =
       local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data.
       array[99];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[100]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[100];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x65];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x66];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x67];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x68];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x69]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x69];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x6f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x70]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x70];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x71]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x71];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x72];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x73]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x73];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x74]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x74];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x75];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x76]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x76];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x77]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x77];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x78];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x79];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x7f];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x80];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x81];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x82];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x83]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x83];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x84];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x85]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x85];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x86]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x86];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x87];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x88];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x89];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8a];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8b];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8c];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8d];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8e];
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = local_980.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>.m_storage.m_data
         .array[0x8f];
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeSimpleConsistentInertiaMatrix(
    ChMatrixNM<double, 12, 12>& M) {
    M.setZero();
    double mu1 = this->sectionA->GetMassPerUnitLength();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmzz1;
    double Jmyy1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    double Jmxx1 = Jmyy1 + Jmzz1;

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmzz2;
    double Jmyy2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    double Jmxx2 = Jmyy2 + Jmzz2;

    double L = this->GetLength();
    double LL = L * L;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;
    double mu = this->avg_sec_par->mu;
    double Jmxx = this->avg_sec_par->Jmxx;

    // The radii of gyration ry,rz are:
    // double ry = pow(Iyy / A, 0.5);
    // double rz = pow(Izz / A, 0.5);
    // We have: Iyy / A == Iyy * pho / (A * pho) = Jyy / mu
    // For wind turbine blade, the above equations are not true, but can be a good approximation.
    // double ry = pow(Jmyy / mu, 0.5);   // wrong modal results, error up to 5%
    // double rz = pow(Jmzz / mu, 0.5);   // wrong modal results, error up to 5%

    // double ry = pow(EImyy / EA, 0.5);  // run error
    // double rz = pow(EImzz / EA, 0.5);  // run error

    // Note: bending inertia has to be switched off!
    double ry = 0;  // Only this setting could give correct modal results
    double rz = 0;  // But, why? TODO: need an explanation

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double ry_L2 = pow(ry / L, 2.0);
    double rz_L2 = pow(rz / L, 2.0);
    double oneplusphiy2 = pow(1 + phiy, 2.0);
    double oneplusphiz2 = pow(1 + phiz, 2.0);
    double mAz = (13. / 35. + 7. / 10. * phiy + 1. / 3. * phiy2 + 6. / 5. * rz_L2) / oneplusphiy2;
    double mAy = (13. / 35. + 7. / 10. * phiz + 1. / 3. * phiz2 + 6. / 5. * ry_L2) / oneplusphiz2;
    double mBy = (9. / 70. + 3. / 10. * phiy + 1. / 6. * phiy2 - 6. / 5. * rz_L2) / oneplusphiy2;
    double mBz = (9. / 70. + 3. / 10. * phiz + 1. / 6. * phiz2 - 6. / 5. * ry_L2) / oneplusphiz2;
    double mCy =
        (11. / 210. + 11. / 120. * phiy + 1. / 24. * phiy2 + (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mCz =
        (11. / 210. + 11. / 120. * phiz + 1. / 24. * phiz2 + (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mDy =
        (13. / 420. + 3. / 40. * phiy + 1. / 24. * phiy2 - (1. / 10. - 1. / 2. * phiy) * rz_L2) * L / oneplusphiy2;
    double mDz =
        (13. / 420. + 3. / 40. * phiz + 1. / 24. * phiz2 - (1. / 10. - 1. / 2. * phiz) * ry_L2) * L / oneplusphiz2;
    double mEy =
        (1. / 105. + 1. / 60. * phiy + 1. / 120. * phiy2 + (2. / 15. + 1. / 6. * phiy + 1. / 3. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mEz =
        (1. / 105. + 1. / 60. * phiz + 1. / 120. * phiz2 + (2. / 15. + 1. / 6. * phiz + 1. / 3. * phiz2) * ry_L2) * LL /
        oneplusphiz2;
    double mFy =
        (1. / 140. + 1. / 60. * phiy + 1. / 120. * phiy2 + (1. / 30. + 1. / 6. * phiy - 1. / 6. * phiy2) * rz_L2) * LL /
        oneplusphiy2;
    double mFz =
        (1. / 140. + 1. / 60. * phiz + 1. / 120. * phiz2 + (1. / 30. + 1. / 6. * phiz - 1. / 6. * phiz2) * ry_L2) * LL /
        oneplusphiz2;

    double mt1 = mu1 * L;
    double mt2 = mu2 * L;
    double mt = mu * L;

    M(0, 0) = mt1 / 3.0;
    M(6, 6) = mt2 / 3.0;
    M(6, 0) = mt / 6.0;
    M(0, 6) = M(6, 0);

    M(3, 3) = Jmxx1 * L / 3.0;
    M(9, 9) = Jmxx2 * L / 3.0;
    M(9, 3) = Jmxx * L / 6.0;
    M(3, 9) = M(9, 3);

    M(1, 1) = mt1 * mAz;
    M(2, 2) = mt1 * mAy;
    M(4, 4) = mt1 * mEy;
    M(5, 5) = mt1 * mEz;
    M(7, 7) = mt2 * mAz;
    M(8, 8) = mt2 * mAy;
    M(10, 10) = mt2 * mEy;
    M(11, 11) = mt2 * mEz;

    M(4, 2) = -mt1 * mCy;
    M(5, 1) = mt1 * mCz;
    M(7, 1) = mt * mBz;
    M(8, 2) = mt * mBy;
    M(7, 5) = mt * mDz;
    M(8, 4) = -mt * mDy;
    M(10, 2) = mt * mDy;
    M(11, 1) = -mt * mDz;
    M(10, 4) = -mt * mFy;
    M(11, 5) = -mt * mFz;
    M(10, 8) = mt2 * mCy;
    M(11, 7) = -mt2 * mCz;

    M(2, 4) = M(4, 2);
    M(1, 5) = M(5, 1);
    M(1, 7) = M(7, 1);
    M(2, 8) = M(8, 2);
    M(5, 7) = M(7, 5);
    M(4, 8) = M(8, 4);
    M(2, 10) = M(10, 2);
    M(1, 11) = M(11, 1);
    M(4, 10) = M(10, 4);
    M(5, 11) = M(11, 5);
    M(8, 10) = M(10, 8);
    M(7, 11) = M(11, 7);

    // In case the section is rotated:
    ChMatrix33<> RotsectA;
    RotsectA.Set_A_Rxyz(ChVector<>(mass_phi1, 0, 0));
    ChMatrix33<> RotsectB;
    RotsectB.Set_A_Rxyz(ChVector<>(mass_phi2, 0, 0));
    ChMatrixNM<double, 12, 12> Rotsect;
    Rotsect.setZero();
    Rotsect.block<3, 3>(0, 0) = RotsectA;
    Rotsect.block<3, 3>(3, 3) = RotsectA;
    Rotsect.block<3, 3>(6, 6) = RotsectB;
    Rotsect.block<3, 3>(9, 9) = RotsectB;
    M = Rotsect.transpose() * M * Rotsect;

    // transformation matrix for section A
    ChMatrixNM<double, 6, 6> Tm1;
    Tm1.setIdentity();
    Tm1(0, 4) = Mz1;
    Tm1(0, 5) = -My1;
    Tm1(1, 3) = -Mz1;
    Tm1(2, 3) = My1;

    // transformation matrix for section B
    ChMatrixNM<double, 6, 6> Tm2;
    Tm2.setIdentity();
    Tm2(0, 4) = Mz2;
    Tm2(0, 5) = -My2;
    Tm2(1, 3) = -Mz2;
    Tm2(2, 3) = My2;

    // whole transformation matrix
    ChMatrixNM<double, 12, 12> Tm;
    Tm.setZero();
    Tm.block<6, 6>(0, 0) = Tm1;
    Tm.block<6, 6>(6, 6) = Tm2;

    // do the transformation for mass matrix
    M = Tm.transpose() * M * Tm;
}